

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseElemExprVarListOpt(WastParser *this,ExprListVector *out_list)

{
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  pointer *__ptr;
  ExprList init_expr;
  Var var;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_c0);
  local_c8._0_4_ = Index;
  local_c8._4_4_ = 0;
  local_e8._16_8_ = 0;
  local_e8._24_8_ = 0;
  while( true ) {
    Var::Var(&local_78);
    bVar3 = ParseVarOpt(this,&local_c0,&local_78);
    Var::~Var(&local_78);
    if (!bVar3) break;
    std::make_unique<wabt::VarExpr<(wabt::ExprType)36>,wabt::Var&>((Var *)local_e8);
    local_e8._8_8_ = local_e8._0_8_;
    local_e8._0_8_ = (long *)0x0;
    intrusive_list<wabt::Expr>::push_back
              ((intrusive_list<wabt::Expr> *)(local_e8 + 0x10),
               (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)(local_e8 + 8));
    if ((long *)local_e8._8_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_e8._8_8_ + 8))();
    }
    local_e8._8_8_ = (char *)0x0;
    if ((long *)local_e8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_e8._0_8_ + 8))();
    }
    std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>::
    emplace_back<wabt::intrusive_list<wabt::Expr>>
              ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                *)out_list,(intrusive_list<wabt::Expr> *)(local_e8 + 0x10));
  }
  piVar1 = (out_list->
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (out_list->
           super__Vector_base<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  intrusive_list<wabt::Expr>::clear((intrusive_list<wabt::Expr> *)(local_e8 + 0x10));
  Var::~Var(&local_c0);
  return piVar1 != piVar2;
}

Assistant:

bool WastParser::ParseElemExprVarListOpt(ExprListVector* out_list) {
  WABT_TRACE(ParseElemExprVarListOpt);
  Var var;
  ExprList init_expr;
  while (ParseVarOpt(&var)) {
    init_expr.push_back(std::make_unique<RefFuncExpr>(var));
    out_list->push_back(std::move(init_expr));
  }
  return !out_list->empty();
}